

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.h
# Opt level: O0

void __thiscall chrono::curiosity::CuriosityPart::~CuriosityPart(CuriosityPart *this)

{
  CuriosityPart *this_local;
  
  this->_vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_002ee878;
  ChFrame<double>::~ChFrame(&this->m_cog);
  ChFrame<double>::~ChFrame(&this->m_pos);
  ChFrame<double>::~ChFrame(&this->m_mesh_xform);
  std::__cxx11::string::~string((string *)&this->m_mesh_name);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&this->m_mat);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&this->m_body);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual ~CuriosityPart() {}